

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O1

void msr_get_context(raplcap_msr_ctx *ctx,uint32_t cpu_model,uint64_t units_msrval)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  double dVar4;
  raplcap_msr_zone_cfg *prVar5;
  uint *in_RCX;
  uint *puVar6;
  uint uVar7;
  uint extraout_EDX;
  ulong extraout_RDX;
  long *plVar8;
  uint *in_R8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  if (ctx == (raplcap_msr_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x149,"void msr_get_context(raplcap_msr_ctx *, uint32_t, uint64_t)");
  }
  if (cpu_model == 0) {
    __assert_fail("cpu_model > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x14a,"void msr_get_context(raplcap_msr_ctx *, uint32_t, uint64_t)");
  }
  ctx->cpu_model = cpu_model;
  uVar7 = (uint)units_msrval;
  uVar1 = (uint)(units_msrval >> 8);
  puVar6 = in_RCX;
  if ((int)cpu_model < 0x7a) {
    cpu_model = cpu_model - 0x2a;
    if (0x42 < cpu_model) {
switchD_001041f9_caseD_1:
      msr_get_context_cold_1();
      if (ctx == (raplcap_msr_ctx *)0x0) {
        __assert_fail("ctx != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                      ,0x1e6,
                      "int msr_is_constraint_supported(const raplcap_msr_ctx *, raplcap_zone, raplcap_constraint)"
                     );
      }
      if (((extraout_EDX != 0) &&
          (puVar6 = (uint *)CONCAT71((int7)((ulong)puVar6 >> 8),1), extraout_EDX != 1)) &&
         (extraout_EDX != 2)) {
        plVar8 = (long *)(ulong)extraout_EDX;
        msr_is_constraint_supported_cold_1();
        if (plVar8 == (long *)0x0) {
          __assert_fail("ctx != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                        ,0x209,
                        "int msr_is_zone_enabled(const raplcap_msr_ctx *, raplcap_zone, uint64_t, int *, int *)"
                       );
        }
        lVar9 = 0x2f;
        iVar3 = 0xf;
        if ((cpu_model == 4) && ((*(uint *)(plVar8 + 6) | 0x40) == 0xcf)) {
          lVar9 = 0x31;
          iVar3 = 0x11;
        }
        if (puVar6 != (uint *)0x0) {
          *puVar6 = (uint)(((uint)extraout_RDX >> iVar3 & 1) != 0);
        }
        if ((in_R8 != (uint *)0x0) && (1 < *(byte *)(*plVar8 + 0x28 + (ulong)cpu_model * 0x30))) {
          *in_R8 = (uint)((extraout_RDX >> lVar9 & 1) != 0);
        }
        return;
      }
      return;
    }
    bVar2 = (byte)units_msrval;
    puVar6 = (uint *)((long)&switchD_001041f9::switchdataD_001063d8 +
                     (long)(int)(&switchD_001041f9::switchdataD_001063d8)[cpu_model]);
    switch(cpu_model) {
    case 0:
    case 3:
    case 0x10:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x24:
    case 0x32:
    case 0x34:
    case 0x35:
    case 0x3c:
      goto switchD_001041f9_caseD_0;
    default:
      goto switchD_001041f9_caseD_1;
    case 0xd:
    case 0x20:
    case 0x30:
    case 0x33:
      dVar4 = (double)(1L << ((byte)(units_msrval >> 8) & 0x1f)) / 1000000.0;
      ctx->power_units = (double)(1 << (bVar2 & 0xf)) / 1000.0;
      prVar5 = CFG_ATOM;
      dVar10 = dVar4;
      dVar11 = dVar4;
      break;
    case 0x15:
    case 0x25:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x40:
    case 0x42:
switchD_001041f9_caseD_15:
      ctx->power_units = (double)(((ulong)(uVar7 & 0xf) ^ 0x3ff) << 0x34);
      dVar4 = (double)(((ulong)(uVar1 & 0x1f) ^ 0x3ff) << 0x34);
      prVar5 = CFG_DEFAULT;
      dVar10 = 1.53e-05;
      dVar11 = dVar4;
      break;
    case 0x22:
      ctx->power_units = (double)(1 << (bVar2 & 0xf)) / 1000.0;
      dVar4 = (double)(((ulong)(uVar1 & 0x1f) ^ 0x3ff) << 0x34);
      prVar5 = CFG_ATOM_AIRMONT;
      dVar10 = dVar4;
      dVar11 = dVar4;
      break;
    case 0x23:
      ctx->power_units = (double)(1 << (bVar2 & 0xf)) / 1000.0;
      goto LAB_00104410;
    }
  }
  else {
    if ((int)cpu_model < 0x9c) {
      if ((int)cpu_model < 0x96) {
        cpu_model = cpu_model - 0x7a;
        if (0x15 < cpu_model) goto switchD_001041f9_caseD_1;
        puVar6 = (uint *)((long)&switchD_0010429e::switchdataD_001064e4 +
                         (long)(int)(&switchD_0010429e::switchdataD_001064e4)[cpu_model]);
        switch(cpu_model) {
        case 0:
        case 3:
        case 4:
        case 0xc:
        case 0x14:
          goto switchD_001041f9_caseD_0;
        default:
          goto switchD_001041f9_caseD_1;
        case 0xb:
          goto switchD_001041f9_caseD_15;
        case 0x12:
        case 0x13:
          goto switchD_0010431c_caseD_b7;
        case 0x15:
          goto switchD_0010429e_caseD_15;
        }
      }
      if (cpu_model != 0x96) {
        if ((cpu_model != 0x97) && (cpu_model != 0x9a)) goto switchD_001041f9_caseD_1;
switchD_0010431c_caseD_b7:
        ctx->power_units = (double)(((ulong)(uVar7 & 0xf) ^ 0x3ff) << 0x34);
        dVar4 = (double)(((ulong)(uVar1 & 0x1f) ^ 0x3ff) << 0x34);
        prVar5 = CFG_DEFAULT_PL4;
        dVar10 = dVar4;
        dVar11 = dVar4;
        goto LAB_00104436;
      }
    }
    else if ((int)cpu_model < 0xad) {
      if ((int)cpu_model < 0xa5) {
        if ((cpu_model != 0x9c) && (cpu_model != 0x9e)) goto switchD_001041f9_caseD_1;
      }
      else if (1 < cpu_model - 0xa5) {
        if (cpu_model != 0xaa) goto switchD_001041f9_caseD_1;
        goto switchD_0010431c_caseD_bd;
      }
    }
    else {
      puVar6 = &switchD_0010431c::switchdataD_0010653c;
      switch(cpu_model) {
      case 0xb7:
      case 0xba:
      case 0xbf:
        goto switchD_0010431c_caseD_b7;
      case 0xb8:
      case 0xb9:
      case 0xbb:
      case 0xbc:
      case 0xbe:
        goto switchD_001041f9_caseD_1;
      case 0xbd:
switchD_0010431c_caseD_bd:
        ctx->power_units = (double)(((ulong)(uVar7 & 0xf) ^ 0x3ff) << 0x34);
        dVar4 = (double)(((ulong)(uVar1 & 0x1f) ^ 0x3ff) << 0x34);
        prVar5 = CFG_METEORLAKE;
        dVar10 = dVar4;
        dVar11 = dVar4;
        goto LAB_00104436;
      default:
        if (2 < cpu_model - 0xad) {
          puVar6 = in_RCX;
          if (cpu_model != 0xcf) goto switchD_001041f9_caseD_1;
switchD_0010429e_caseD_15:
          ctx->power_units = (double)(((ulong)(uVar7 & 0xf) ^ 0x3ff) << 0x34);
          dVar4 = (double)(((ulong)(uVar1 & 0x1f) ^ 0x3ff) << 0x34);
          prVar5 = CFG_SPR;
          dVar10 = 6.1e-05;
          dVar11 = 1.0;
          goto LAB_00104436;
        }
      }
    }
switchD_001041f9_caseD_0:
    ctx->power_units = (double)(((ulong)(uVar7 & 0xf) ^ 0x3ff) << 0x34);
LAB_00104410:
    dVar4 = (double)(((ulong)(uVar1 & 0x1f) ^ 0x3ff) << 0x34);
    prVar5 = CFG_DEFAULT;
    dVar10 = dVar4;
    dVar11 = dVar4;
  }
LAB_00104436:
  ctx->energy_units = dVar4;
  ctx->energy_units_dram = dVar10;
  ctx->energy_units_psys = dVar11;
  ctx->time_units = (double)(((ulong)(uVar7 >> 0x10 & 0xf) ^ 0x3ff) << 0x34);
  ctx->cfg = prVar5;
  return;
}

Assistant:

void msr_get_context(raplcap_msr_ctx* ctx, uint32_t cpu_model, uint64_t units_msrval) {
  assert(ctx != NULL);
  assert(cpu_model > 0);
  ctx->cpu_model = cpu_model;
  switch (cpu_model) {
    case CPUID_MODEL_SANDYBRIDGE:
    case CPUID_MODEL_SANDYBRIDGE_X:
    //
    case CPUID_MODEL_IVYBRIDGE:
    case CPUID_MODEL_IVYBRIDGE_X:
    //
    case CPUID_MODEL_HASWELL:
    case CPUID_MODEL_HASWELL_L:
    case CPUID_MODEL_HASWELL_G:
    //
    case CPUID_MODEL_BROADWELL:
    case CPUID_MODEL_BROADWELL_G:
    //
    case CPUID_MODEL_SKYLAKE_L:
    case CPUID_MODEL_SKYLAKE:
    //
    case CPUID_MODEL_KABYLAKE_L:
    case CPUID_MODEL_KABYLAKE:
    //
    case CPUID_MODEL_CANNONLAKE_L:
    //
    case CPUID_MODEL_ICELAKE:
    case CPUID_MODEL_ICELAKE_L:
    //
    case CPUID_MODEL_COMETLAKE:
    case CPUID_MODEL_COMETLAKE_L:
    //
    case CPUID_MODEL_GRANITERAPIDS_X:
    case CPUID_MODEL_GRANITERAPIDS_D:
    //
    case CPUID_MODEL_ATOM_GOLDMONT:
    case CPUID_MODEL_ATOM_GOLDMONT_D:
    case CPUID_MODEL_ATOM_GOLDMONT_PLUS:
    case CPUID_MODEL_ATOM_TREMONT_D:
    case CPUID_MODEL_ATOM_TREMONT:
    case CPUID_MODEL_ATOM_TREMONT_L:
    //
    case CPUID_MODEL_ATOM_CRESTMONT_X:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_DEFAULT;
      break;
    //----
    case CPUID_MODEL_SAPPHIRERAPIDS_X:
    //
    case CPUID_MODEL_EMERALDRAPIDS_X:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = 0.000061;
      ctx->energy_units_psys = 1.0;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_SPR;
      break;
    //----
    case CPUID_MODEL_TIGERLAKE_L:
    case CPUID_MODEL_TIGERLAKE:
    //
    case CPUID_MODEL_ALDERLAKE:
    case CPUID_MODEL_ALDERLAKE_L:
    //
    case CPUID_MODEL_RAPTORLAKE:
    case CPUID_MODEL_RAPTORLAKE_P:
    case CPUID_MODEL_RAPTORLAKE_S:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_DEFAULT_PL4;
      break;
    //----
    case CPUID_MODEL_METEORLAKE_L:
    //
    case CPUID_MODEL_LUNARLAKE_M:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_METEORLAKE;
      break;
    //----
    case CPUID_MODEL_HASWELL_X:
    case CPUID_MODEL_BROADWELL_X:
    case CPUID_MODEL_BROADWELL_D:
    case CPUID_MODEL_SKYLAKE_X:
    case CPUID_MODEL_ICELAKE_X:
    case CPUID_MODEL_ICELAKE_D:
    case CPUID_MODEL_XEON_PHI_KNL:
    case CPUID_MODEL_XEON_PHI_KNM:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = 0.0000153;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_DEFAULT;
      break;
    //----
    case CPUID_MODEL_ATOM_SILVERMONT:
    case CPUID_MODEL_ATOM_SILVERMONT_MID:
    case CPUID_MODEL_ATOM_AIRMONT_MID:
    case CPUID_MODEL_ATOM_SOFIA:
      ctx->power_units = from_msr_pu_atom(units_msrval);
      ctx->energy_units = from_msr_eu_atom(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_ATOM;
      break;
    case CPUID_MODEL_ATOM_SILVERMONT_D:
      ctx->power_units = from_msr_pu_atom(units_msrval);
      // The Intel SDM claims we should use from_msr_eu_atom, but that appears to be incorrect
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_DEFAULT;
      break;
    //----
    case CPUID_MODEL_ATOM_AIRMONT:
      ctx->power_units = from_msr_pu_atom(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_ATOM_AIRMONT;
      break;
    //----
    default:
      raplcap_log(ERROR, "Unknown architecture\n");
      raplcap_log(ERROR, "Please report a bug if you see this message, it should never occur!\n");
      assert(0);
      return;
  }
  raplcap_log(DEBUG, "msr_get_context: model=%02X, "
              "power_units=%.12f, energy_units=%.12f, energy_units_dram=%.12f, energy_units_psys=%.12f, "
              "time_units=%.12f\n",
              ctx->cpu_model, ctx->power_units, ctx->energy_units, ctx->energy_units_dram, ctx->energy_units_psys,
              ctx->time_units);
}